

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

bool __thiscall
slang::ast::DiagnosticVisitor::tryApplyFromCache(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  InstanceSideEffects *pIVar5;
  IfacePortDriver *pIVar6;
  int iVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
  *ppVar10;
  ulong uVar11;
  uint uVar12;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *arrays_;
  ulong uVar13;
  ulong pos0;
  ulong uVar14;
  ulong uVar15;
  InstanceBodySymbol *args_2;
  ulong hash;
  group_type_pointer pgVar16;
  long lVar17;
  IfacePortDriver *ifacePortDriver;
  pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry> *other
  ;
  IfacePortDriver *ifacePortDriver_00;
  undefined1 auVar18 [16];
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  try_emplace_args_t local_d2;
  bool valid;
  ulong local_d0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
  *local_c8;
  ulong local_c0;
  InstanceBodySymbol *local_b8;
  long local_b0;
  group_type_pointer local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  uchar uStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  uchar uStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  InstanceCacheKey key;
  locator res;
  
  if (this->disableCache != false) {
    return false;
  }
  if (symbol->resolvedConfig != (ResolvedConfig *)0x0) {
    return false;
  }
  if ((symbol->body->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) ||
     ((symbol->body->flags).m_bits != '\0')) {
    return false;
  }
  valid = true;
  InstanceCacheKey::InstanceCacheKey(&key,symbol,&valid);
  if (valid == true) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = key.savedHash;
    arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
               *)&this->instanceCache;
    args_2 = symbol->body;
    hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
    uVar13 = hash >> ((byte)(this->instanceCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                            .arrays.groups_size_index & 0x3f);
    lVar17 = (hash & 0xff) * 4;
    uVar19 = (&UNK_004b638c)[lVar17];
    uVar20 = (&UNK_004b638d)[lVar17];
    uVar21 = (&UNK_004b638e)[lVar17];
    uVar22 = (&UNK_004b638f)[lVar17];
    uVar11 = (ulong)((uint)hash & 7);
    uVar15 = 0;
    pos0 = uVar13;
    uVar23 = uVar19;
    uVar24 = uVar20;
    uVar25 = uVar21;
    uVar26 = uVar22;
    uVar27 = uVar19;
    uVar28 = uVar20;
    uVar29 = uVar21;
    uVar30 = uVar22;
    uVar31 = uVar19;
    uVar32 = uVar20;
    uVar33 = uVar21;
    uVar34 = uVar22;
    do {
      pgVar16 = (this->instanceCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                .arrays.groups_;
      pgVar2 = pgVar16 + uVar13;
      auVar18[0] = -(pgVar2->m[0].n == uVar19);
      auVar18[1] = -(pgVar2->m[1].n == uVar20);
      auVar18[2] = -(pgVar2->m[2].n == uVar21);
      auVar18[3] = -(pgVar2->m[3].n == uVar22);
      auVar18[4] = -(pgVar2->m[4].n == uVar23);
      auVar18[5] = -(pgVar2->m[5].n == uVar24);
      auVar18[6] = -(pgVar2->m[6].n == uVar25);
      auVar18[7] = -(pgVar2->m[7].n == uVar26);
      auVar18[8] = -(pgVar2->m[8].n == uVar27);
      auVar18[9] = -(pgVar2->m[9].n == uVar28);
      auVar18[10] = -(pgVar2->m[10].n == uVar29);
      auVar18[0xb] = -(pgVar2->m[0xb].n == uVar30);
      auVar18[0xc] = -(pgVar2->m[0xc].n == uVar31);
      auVar18[0xd] = -(pgVar2->m[0xd].n == uVar32);
      auVar18[0xe] = -(pgVar2->m[0xe].n == uVar33);
      auVar18[0xf] = -(pgVar2->m[0xf].n == uVar34);
      uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      uVar14 = uVar15;
      lVar17 = uVar13 * 0x10;
      if (uVar12 != 0) {
        ppVar3 = (this->instanceCache).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                 .arrays.elements_;
        local_d0 = pos0;
        local_c8 = arrays_;
        local_c0 = hash;
        local_b8 = args_2;
        local_b0 = uVar13 * 0x10;
        local_a8 = pgVar16;
        local_a0 = uVar15;
        local_98 = uVar13;
        local_90 = uVar11;
        local_88 = uVar19;
        uStack_87 = uVar20;
        uStack_86 = uVar21;
        uStack_85 = uVar22;
        uStack_84 = uVar23;
        uStack_83 = uVar24;
        uStack_82 = uVar25;
        uStack_81 = uVar26;
        uStack_80 = uVar27;
        uStack_7f = uVar28;
        uStack_7e = uVar29;
        uStack_7d = uVar30;
        uStack_7c = uVar31;
        uStack_7b = uVar32;
        uStack_7a = uVar33;
        uStack_79 = uVar34;
        do {
          iVar7 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          other = (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
                   *)((long)&ppVar3[uVar13 * 0xf].first.symbol.ptr + (ulong)(uint)(iVar7 << 6));
          bVar9 = InstanceCacheKey::operator==(&key,(InstanceCacheKey *)other);
          arrays_ = local_c8;
          pos0 = local_d0;
          args_2 = local_b8;
          hash = local_c0;
          if (bVar9) goto LAB_002f838b;
          uVar12 = uVar12 - 1 & uVar12;
        } while (uVar12 != 0);
        uVar11 = local_90;
        uVar13 = local_98;
        uVar14 = local_a0;
        pgVar16 = local_a8;
        lVar17 = local_b0;
        other = (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
                 *)&valid;
        uVar19 = local_88;
        uVar20 = uStack_87;
        uVar21 = uStack_86;
        uVar22 = uStack_85;
        uVar23 = uStack_84;
        uVar24 = uStack_83;
        uVar25 = uStack_82;
        uVar26 = uStack_81;
        uVar27 = uStack_80;
        uVar28 = uStack_7f;
        uVar29 = uStack_7e;
        uVar30 = uStack_7d;
        uVar31 = uStack_7c;
        uVar32 = uStack_7b;
        uVar33 = uStack_7a;
        uVar34 = uStack_79;
        if (bVar9) goto LAB_002f838b;
      }
      if ((pgVar16->m[lVar17 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar11]) == 0) break;
      uVar4 = (this->instanceCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
              .arrays.groups_size_mask;
      uVar15 = uVar14 + 1;
      uVar13 = uVar13 + uVar14 + 1 & uVar4;
    } while (uVar15 <= uVar4);
    other = (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
             *)0x0;
LAB_002f838b:
    ppVar10 = other;
    if (other == (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
                  *)0x0) {
      if ((this->instanceCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
          .size_ctrl.size <
          (this->instanceCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                  (&res,arrays_,(arrays_type *)arrays_,pos0,hash,&local_d2,&key,args_2);
        psVar1 = &(this->instanceCache).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        ppVar10 = res.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
                  (&res,arrays_,hash,&local_d2,&key,args_2);
        ppVar10 = res.p;
      }
    }
    if (other != (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
                  *)0x0) {
      if ((ppVar10->second).sideEffects.
          super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
          _M_payload.
          super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
          _M_engaged == false) {
        tryApplyFromCache();
      }
      if ((ppVar10->second).sideEffects.
          super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
          _M_payload.
          super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
          _M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      pIVar5 = (ppVar10->second).sideEffects.
               super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>
               ._M_payload.
               super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
               _M_payload._M_value;
      if ((pIVar5 == (InstanceSideEffects *)0x0) ||
         ((pIVar5->cannotCache == false &&
          ((pIVar5->upwardNames).
           super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           *(pointer *)
            ((long)&(pIVar5->upwardNames).
                    super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                    ._M_impl + 8))))) {
        symbol->canonicalBody = (ppVar10->second).canonicalBody.ptr;
        uVar12 = (this->compilation->options).flags.m_bits & 0x4000;
        bVar9 = uVar12 == 0;
        if ((char)(uVar12 >> 0xe) == '\0' && pIVar5 != (InstanceSideEffects *)0x0) {
          pIVar6 = *(pointer *)
                    ((long)&(pIVar5->ifacePortDrivers).
                            super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
                            ._M_impl + 8);
          bVar9 = true;
          for (ifacePortDriver_00 =
                    *(IfacePortDriver **)
                     &(pIVar5->ifacePortDrivers).
                      super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
                      ._M_impl; ifacePortDriver_00 != pIVar6;
              ifacePortDriver_00 = ifacePortDriver_00 + 1) {
            applyInstanceSideEffect(this,ifacePortDriver_00,symbol);
          }
        }
        goto LAB_002f8411;
      }
    }
  }
  bVar9 = false;
LAB_002f8411:
  std::
  vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ::~vector(&key.ifaceKeys);
  return bVar9;
}

Assistant:

bool tryApplyFromCache(const InstanceSymbol& symbol) {
        if (disableCache)
            return false;

        // We can use a cached version of this instance's body if we have already
        // visited an identical body elsewhere, with some caveats explained below.
        SLANG_ASSERT(symbol.getCanonicalBody() == nullptr);

        // Instances that are targeted by defparams, bind directives, or configuration rules,
        // or that are themselves created by a bind directive, cannot participate in caching.
        if (!isEligibleForCaching(symbol))
            return false;

        // "Identical" needs to take into account parameter values and interface ports,
        // since the types of members and expression can vary based on those. This is
        // computed in the InstanceCacheKey.
        //
        // Interface ports must be connected to instances that themselves follow the
        // restrictions on defparams, bind directives, and config rules. This is checked
        // in the InstanceCacheKey constructor and returned in the 'valid' parameter.
        bool valid = true;
        InstanceCacheKey key(symbol, valid);
        if (!valid)
            return false;

        auto [it, inserted] = instanceCache.try_emplace(std::move(key), symbol.body);
        if (inserted)
            return false;

        // If we haven't resolved the side effects entry yet do that now.
        // We do this opportunistically here because we know we have a cache hit.
        auto& entry = it->second;
        if (!entry.sideEffects) {
            if (auto sideEffectIt = compilation.instanceSideEffectMap.find(entry.canonicalBody);
                sideEffectIt != compilation.instanceSideEffectMap.end()) {
                entry.sideEffects = sideEffectIt->second.get();
            }
            else {
                entry.sideEffects = nullptr;
            }
        }

        // If any hierarchical names extend upward out of the instance we won't consider
        // it for caching, since the names could be different based on the context.
        // This could be optimized in the future by having another layer of caching based
        // on what the name resolves to for each instance.
        auto sideEffects = entry.sideEffects.value();
        if (sideEffects && (sideEffects->cannotCache || !sideEffects->upwardNames.empty())) {
            return false;
        }

        // Assuming we find an appropriately cached instance, we will store a pointer to it
        // in other instances to facilitate downstream consumers in not needing to recreate
        // this duplication detection logic again.
        symbol.setCanonicalBody(*entry.canonicalBody);
        if (compilation.hasFlag(CompilationFlags::DisableInstanceCaching))
            return false;

        // Apply any side effects that come from the cached instance
        // in the context of the current instance.
        if (sideEffects) {
            for (auto& ifacePortDriver : sideEffects->ifacePortDrivers)
                applyInstanceSideEffect(ifacePortDriver, symbol);
        }

        return true;
    }